

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O3

void __thiscall
slang::ast::builtins::RealMath1Function<&tan>::RealMath1Function
          (RealMath1Function<&tan> *this,Compilation *comp,string *name)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_41;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_40;
  Type *local_28;
  
  local_28 = comp->realType;
  __l._M_len = 1;
  __l._M_array = &local_28;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_40,__l,&local_41);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,name,Function,1,&local_40,comp->realType,false,
             false);
  if (local_40.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_0050dff0;
  return;
}

Assistant:

RealMath1Function(Compilation& comp, const std::string& name) :
        SimpleSystemSubroutine(name, SubroutineKind::Function, 1, {&comp.getRealType()},
                               comp.getRealType(), false) {}